

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

connectdata * cpool_get_oldest_idle(cpool *cpool)

{
  cpool_bundle *pcVar1;
  size_t sVar2;
  timediff_t tVar3;
  curltime cVar4;
  curltime newer;
  curltime older;
  connectdata *conn;
  timediff_t score;
  timediff_t highscore;
  curltime now;
  cpool_bundle *bundle;
  connectdata *oldest_idle;
  Curl_hash_element *he;
  Curl_llist_node *curr;
  Curl_hash_iterator iter;
  cpool *cpool_local;
  
  bundle = (cpool_bundle *)0x0;
  score = -1;
  iter.current_element = (Curl_llist_node *)cpool;
  cVar4 = Curl_now();
  Curl_hash_start_iterate((Curl_hash *)iter.current_element,(Curl_hash_iterator *)&curr);
  oldest_idle = (connectdata *)Curl_hash_next_element((Curl_hash_iterator *)&curr);
  while (oldest_idle != (connectdata *)0x0) {
    for (he = (Curl_hash_element *)Curl_llist_head((Curl_llist *)oldest_idle->fclosesocket);
        he != (Curl_hash_element *)0x0; he = (Curl_hash_element *)Curl_node_next(&he->list)) {
      pcVar1 = (cpool_bundle *)Curl_node_elem(&he->list);
      sVar2 = Curl_llist_count((Curl_llist *)pcVar1[0x14].dest);
      if ((((sVar2 == 0) && (((ulong)pcVar1[0x13].dest[0] >> 5 & 1) == 0)) &&
          (*(char *)((long)&pcVar1[0x1d].conns._dtor + 5) == '\0')) &&
         (newer._12_4_ = 0, newer.tv_sec = SUB128(cVar4._0_12_,0),
         newer.tv_usec = SUB124(cVar4._0_12_,8), older._12_4_ = 0,
         older._0_12_ = *(undefined1 (*) [12])&pcVar1[0xb].conns._size,
         tVar3 = Curl_timediff(newer,older), score < tVar3)) {
        score = tVar3;
        bundle = pcVar1;
      }
    }
    oldest_idle = (connectdata *)Curl_hash_next_element((Curl_hash_iterator *)&curr);
  }
  return (connectdata *)bundle;
}

Assistant:

static struct connectdata *cpool_get_oldest_idle(struct cpool *cpool)
{
  struct Curl_hash_iterator iter;
  struct Curl_llist_node *curr;
  struct Curl_hash_element *he;
  struct connectdata *oldest_idle = NULL;
  struct cpool_bundle *bundle;
  struct curltime now;
  timediff_t highscore =- 1;
  timediff_t score;

  now = Curl_now();
  Curl_hash_start_iterate(&cpool->dest2bundle, &iter);

  for(he = Curl_hash_next_element(&iter); he;
      he = Curl_hash_next_element(&iter)) {
    struct connectdata *conn;
    bundle = he->ptr;

    for(curr = Curl_llist_head(&bundle->conns); curr;
        curr = Curl_node_next(curr)) {
      conn = Curl_node_elem(curr);
      if(CONN_INUSE(conn) || conn->bits.close || conn->connect_only)
        continue;
      /* Set higher score for the age passed since the connection was used */
      score = Curl_timediff(now, conn->lastused);
      if(score > highscore) {
        highscore = score;
        oldest_idle = conn;
      }
    }
  }
  return oldest_idle;
}